

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O0

Layer * ncnn::Yolov1Detection_layer_creator(void)

{
  Layer *pLVar1;
  Yolov1Detection *in_stack_00000900;
  
  pLVar1 = (Layer *)operator_new(0xe0);
  Yolov1Detection::Yolov1Detection(in_stack_00000900);
  return pLVar1;
}

Assistant:

Yolov1Detection::Yolov1Detection()
{
    one_blob_only = true;
    support_inplace = true;

    softmax = ncnn::create_layer(ncnn::LayerType::Softmax);
    ncnn::ParamDict pd;
    pd.set(0, 1);
    pd.set(1, 1);
    softmax->load_param(pd);
}